

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# value.cpp
# Opt level: O1

bool duckdb::Value::ValuesAreEqual
               (CastFunctionSet *set,GetCastFunctionInput *get_input,Value *result_value,
               Value *value)

{
  LogicalTypeId LVar1;
  pointer pcVar2;
  bool bVar3;
  int iVar4;
  string *psVar5;
  Value *value_00;
  string local_e8;
  Value local_c8;
  string local_88;
  string local_68;
  string local_48;
  
  while( true ) {
    value_00 = value;
    value = result_value;
    if (value->is_null != value_00->is_null) {
      return false;
    }
    if ((value->is_null & value_00->is_null) != 0) {
      return true;
    }
    LVar1 = (value_00->type_).id_;
    if (LVar1 == VARCHAR) break;
    if (LVar1 == DOUBLE) {
      LogicalType::LogicalType((LogicalType *)&local_e8,DOUBLE);
      CastAs(&local_c8,value,set,get_input,(LogicalType *)&local_e8,false);
      LogicalType::~LogicalType((LogicalType *)&local_e8);
      bVar3 = ApproxEqual((value_00->value_).double_,
                          (double)CONCAT44(local_c8.value_.interval.days,local_c8.value_.integer));
      goto LAB_002e858b;
    }
    if (LVar1 == FLOAT) {
      LogicalType::LogicalType((LogicalType *)&local_e8,FLOAT);
      CastAs(&local_c8,value,set,get_input,(LogicalType *)&local_e8,false);
      LogicalType::~LogicalType((LogicalType *)&local_e8);
      bVar3 = ApproxEqual((value_00->value_).float_,local_c8.value_.float_);
      goto LAB_002e858b;
    }
    result_value = value_00;
    if (((value->type_).id_ & ~SQLNULL) != FLOAT) {
      bVar3 = ValueOperations::Equals(value_00,value);
      return bVar3;
    }
  }
  LogicalType::LogicalType((LogicalType *)&local_e8,VARCHAR);
  CastAs(&local_c8,value,set,get_input,(LogicalType *)&local_e8,false);
  LogicalType::~LogicalType((LogicalType *)&local_e8);
  psVar5 = StringValue::Get_abi_cxx11_(&local_c8);
  pcVar2 = (psVar5->_M_dataplus)._M_p;
  local_68._M_dataplus._M_p = (pointer)&local_68.field_2;
  ::std::__cxx11::string::_M_construct<char*>
            ((string *)&local_68,pcVar2,pcVar2 + psVar5->_M_string_length);
  SanitizeValue(&local_e8,&local_68);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_68._M_dataplus._M_p != &local_68.field_2) {
    operator_delete(local_68._M_dataplus._M_p);
  }
  psVar5 = StringValue::Get_abi_cxx11_(value_00);
  pcVar2 = (psVar5->_M_dataplus)._M_p;
  local_88._M_dataplus._M_p = (pointer)&local_88.field_2;
  ::std::__cxx11::string::_M_construct<char*>
            ((string *)&local_88,pcVar2,pcVar2 + psVar5->_M_string_length);
  SanitizeValue(&local_48,&local_88);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_88._M_dataplus._M_p != &local_88.field_2) {
    operator_delete(local_88._M_dataplus._M_p);
  }
  if (local_e8._M_string_length == local_48._M_string_length) {
    if (local_e8._M_string_length == 0) {
      bVar3 = true;
    }
    else {
      iVar4 = bcmp(local_e8._M_dataplus._M_p,local_48._M_dataplus._M_p,local_e8._M_string_length);
      bVar3 = iVar4 == 0;
    }
  }
  else {
    bVar3 = false;
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_48._M_dataplus._M_p != &local_48.field_2) {
    operator_delete(local_48._M_dataplus._M_p);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_e8._M_dataplus._M_p != &local_e8.field_2) {
    operator_delete(local_e8._M_dataplus._M_p);
  }
LAB_002e858b:
  ~Value(&local_c8);
  return bVar3;
}

Assistant:

bool Value::ValuesAreEqual(CastFunctionSet &set, GetCastFunctionInput &get_input, const Value &result_value,
                           const Value &value) {
	if (result_value.IsNull() != value.IsNull()) {
		return false;
	}
	if (result_value.IsNull() && value.IsNull()) {
		// NULL = NULL in checking code
		return true;
	}
	switch (value.type_.id()) {
	case LogicalTypeId::FLOAT: {
		auto other = result_value.CastAs(set, get_input, LogicalType::FLOAT);
		float ldecimal = value.value_.float_;
		float rdecimal = other.value_.float_;
		return ApproxEqual(ldecimal, rdecimal);
	}
	case LogicalTypeId::DOUBLE: {
		auto other = result_value.CastAs(set, get_input, LogicalType::DOUBLE);
		double ldecimal = value.value_.double_;
		double rdecimal = other.value_.double_;
		return ApproxEqual(ldecimal, rdecimal);
	}
	case LogicalTypeId::VARCHAR: {
		auto other = result_value.CastAs(set, get_input, LogicalType::VARCHAR);
		string left = SanitizeValue(StringValue::Get(other));
		string right = SanitizeValue(StringValue::Get(value));
		return left == right;
	}
	default:
		if (result_value.type_.id() == LogicalTypeId::FLOAT || result_value.type_.id() == LogicalTypeId::DOUBLE) {
			return Value::ValuesAreEqual(set, get_input, value, result_value);
		}
		return value == result_value;
	}
}